

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::SpectrumScaledTexture::Evaluate
          (SpectrumScaledTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  TextureEvalContext TVar1;
  Float a;
  ulong extraout_XMM0_Qb;
  undefined1 auVar3 [56];
  undefined1 auVar2 [64];
  undefined1 auVar5 [56];
  undefined1 auVar4 [64];
  SampledSpectrum SVar6;
  anon_class_16_2_278d1f37 func;
  SampledSpectrum local_88;
  TextureEvalContext local_78;
  SampledWavelengths local_38;
  
  TVar1 = ctx;
  local_78.p.super_Tuple3<pbrt::Point3,_float>.x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_78.p.super_Tuple3<pbrt::Point3,_float>.y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_78.p.super_Tuple3<pbrt::Point3,_float>.z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_78.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x
  ;
  local_78.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y
  ;
  local_78.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  local_78.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x
  ;
  local_78.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y
  ;
  local_78.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  local_78.uv.super_Tuple2<pbrt::Point2,_float>.x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  local_78.uv.super_Tuple2<pbrt::Point2,_float>.y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  local_78.dudx = ctx.dudx;
  local_78.dudy = ctx.dudy;
  local_78.dvdx = ctx.dvdx;
  local_78.dvdy = ctx.dvdy;
  local_78.faceIndex = ctx.faceIndex;
  a = TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
      ::
      Dispatch<pbrt::FloatTextureHandle::Evaluate(pbrt::TextureEvalContext)const::_lambda(auto:1)_1_>
                ((TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
                  *)&this->scale,&local_78);
  if ((a != 0.0) || (NAN(a))) {
    local_78._0_16_ = TVar1._0_16_;
    local_78.dpdx.super_Tuple3<pbrt::Vector3,_float>.y =
         ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_78.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
         ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    local_78.dpdy.super_Tuple3<pbrt::Vector3,_float>.x =
         ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    local_78.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
         ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    local_78.dpdy.super_Tuple3<pbrt::Vector3,_float>.z =
         ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
    local_78.uv.super_Tuple2<pbrt::Point2,_float>.x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
    local_78.uv.super_Tuple2<pbrt::Point2,_float>.y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
    local_78.dudx = ctx.dudx;
    local_78.dudy = ctx.dudy;
    local_78.dvdx = ctx.dvdx;
    local_78.dvdy = ctx.dvdy;
    local_78.faceIndex = ctx.faceIndex;
    local_38.lambda.values[0] = lambda.lambda.values[0];
    local_38.lambda.values[1] = lambda.lambda.values[1];
    local_38.lambda.values[2] = lambda.lambda.values[2];
    local_38.lambda.values[3] = lambda.lambda.values[3];
    local_38.pdf.values[0] = lambda.pdf.values[0];
    local_38.pdf.values[1] = lambda.pdf.values[1];
    local_38.pdf.values[2] = lambda.pdf.values[2];
    local_38.pdf.values[3] = lambda.pdf.values[3];
    auVar3 = ZEXT856(extraout_XMM0_Qb);
    auVar5 = ZEXT856((ulong)lambda.lambda.values._8_8_);
    func.lambda = &local_38;
    func.ctx = &local_78;
    SVar6 = TaggedPointer<pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
            ::
            Dispatch<pbrt::SpectrumTextureHandle::Evaluate(pbrt::TextureEvalContext,pbrt::SampledWavelengths)const::_lambda(auto:1)_1_>
                      ((TaggedPointer<pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
                        *)this,func);
    auVar4._0_8_ = SVar6.values.values._8_8_;
    auVar4._8_56_ = auVar5;
    auVar2._0_8_ = SVar6.values.values._0_8_;
    auVar2._8_56_ = auVar3;
    local_78._0_16_ = vmovlhps_avx(auVar2._0_16_,auVar4._0_16_);
    local_88 = SampledSpectrum::operator*((SampledSpectrum *)&local_78,a);
  }
  else {
    SampledSpectrum::SampledSpectrum(&local_88,0.0);
  }
  return (array<float,_4>)(array<float,_4>)local_88;
}

Assistant:

Evaluate(TextureEvalContext ctx, SampledWavelengths lambda) const {
        Float sc = scale.Evaluate(ctx);
        if (sc == 0)
            return SampledSpectrum(0.f);
        return tex.Evaluate(ctx, lambda) * sc;
    }